

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall perfetto::base::UnixSocketRaw::SetRxTimeout(UnixSocketRaw *this,uint32_t timeout_ms)

{
  int iVar1;
  timeval timeout;
  ulong local_18;
  ulong uStack_10;
  
  local_18 = (ulong)timeout_ms / 1000;
  uStack_10 = (ulong)((timeout_ms % 1000) * 1000);
  iVar1 = setsockopt((this->fd_).t_,1,0x14,&local_18,0x10);
  return iVar1 == 0;
}

Assistant:

bool UnixSocketRaw::SetRxTimeout(uint32_t timeout_ms) {
  PERFETTO_DCHECK(fd_);
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  DWORD timeout = timeout_ms;
#else
  struct timeval timeout {};
  uint32_t timeout_sec = timeout_ms / 1000;
  timeout.tv_sec = static_cast<decltype(timeout.tv_sec)>(timeout_sec);
  timeout.tv_usec = static_cast<decltype(timeout.tv_usec)>(
      (timeout_ms - (timeout_sec * 1000)) * 1000);
#endif
  return setsockopt(*fd_, SOL_SOCKET, SO_RCVTIMEO,
                    reinterpret_cast<const char*>(&timeout),
                    sizeof(timeout)) == 0;
}